

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

int cppcms_capi_session_set_exposed(cppcms_capi_session *session,char *key,int is_exposed)

{
  session_interface *in_RSI;
  long in_RDI;
  string *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffa0;
  allocator local_51;
  cppcms_capi_session *in_stack_ffffffffffffffb0;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else {
    anon_unknown.dwarf_2860d0::check_str(in_stack_ffffffffffffffa0);
    cppcms_capi_session::check_loaded_unsaved(in_stack_ffffffffffffffb0);
    booster::hold_ptr<cppcms::session_interface>::operator->
              ((hold_ptr<cppcms::session_interface> *)(in_RDI + 0x78));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,(char *)in_RSI,&local_51);
    cppcms::session_interface::expose(in_RSI,in_stack_ffffffffffffff88,false);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int cppcms_capi_session_set_exposed(cppcms_capi_session *session,char const *key,int is_exposed)
{
	TRY {
		if(!session)
			return -1;
		check_str(key);
		session->check_loaded_unsaved();
		session->p->expose(key,is_exposed);
	}